

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_sizeof_matchState(ZSTD_compressionParameters *cParams,U32 forCCtx)

{
  byte bVar1;
  long lVar3;
  long lVar4;
  uint uVar2;
  
  if (cParams->strategy == ZSTD_fast) {
    lVar3 = 0;
  }
  else {
    lVar3 = 1L << ((byte)cParams->chainLog & 0x3f);
  }
  if ((forCCtx == 0) || (cParams->minMatch != 3)) {
    bVar1 = 0;
  }
  else {
    uVar2 = 0x11;
    if (cParams->windowLog < 0x11) {
      uVar2 = cParams->windowLog;
    }
    bVar1 = (byte)uVar2;
  }
  lVar4 = 0x24608;
  if (cParams->strategy < ZSTD_btopt) {
    lVar4 = 0;
  }
  if (forCCtx == 0) {
    lVar4 = 0;
  }
  return lVar4 + (lVar3 + (1L << (bVar1 & 0x3f)) + (1L << ((byte)cParams->hashLog & 0x3f))) * 4;
}

Assistant:

static size_t
ZSTD_sizeof_matchState(const ZSTD_compressionParameters* const cParams,
                       const U32 forCCtx)
{
    size_t const chainSize = (cParams->strategy == ZSTD_fast) ? 0 : ((size_t)1 << cParams->chainLog);
    size_t const hSize = ((size_t)1) << cParams->hashLog;
    U32    const hashLog3 = (forCCtx && cParams->minMatch==3) ? MIN(ZSTD_HASHLOG3_MAX, cParams->windowLog) : 0;
    size_t const h3Size = ((size_t)1) << hashLog3;
    size_t const tableSpace = (chainSize + hSize + h3Size) * sizeof(U32);
    size_t const optPotentialSpace = ((MaxML+1) + (MaxLL+1) + (MaxOff+1) + (1<<Litbits)) * sizeof(U32)
                          + (ZSTD_OPT_NUM+1) * (sizeof(ZSTD_match_t)+sizeof(ZSTD_optimal_t));
    size_t const optSpace = (forCCtx && (cParams->strategy >= ZSTD_btopt))
                                ? optPotentialSpace
                                : 0;
    DEBUGLOG(4, "chainSize: %u - hSize: %u - h3Size: %u",
                (U32)chainSize, (U32)hSize, (U32)h3Size);
    return tableSpace + optSpace;
}